

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# userauth.c
# Opt level: O0

int libssh2_userauth_password_ex
              (LIBSSH2_SESSION *session,char *username,uint username_len,char *password,
              uint password_len,
              _func_void_LIBSSH2_SESSION_ptr_char_ptr_ptr_int_ptr_void_ptr_ptr *passwd_change_cb)

{
  int iVar1;
  time_t start_time;
  time_t entry_time;
  int rc;
  _func_void_LIBSSH2_SESSION_ptr_char_ptr_ptr_int_ptr_void_ptr_ptr *passwd_change_cb_local;
  uint password_len_local;
  char *password_local;
  uint username_len_local;
  char *username_local;
  LIBSSH2_SESSION *session_local;
  
  start_time = time((time_t *)0x0);
  while( true ) {
    iVar1 = userauth_password(session,username,username_len,(uchar *)password,password_len,
                              passwd_change_cb);
    if (iVar1 != -0x25) {
      return iVar1;
    }
    if (session->api_block_mode == 0) break;
    iVar1 = _libssh2_wait_socket(session,start_time);
    if (iVar1 != 0) {
      return iVar1;
    }
  }
  return -0x25;
}

Assistant:

LIBSSH2_API int
libssh2_userauth_password_ex(LIBSSH2_SESSION *session, const char *username,
                             unsigned int username_len, const char *password,
                             unsigned int password_len,
                             LIBSSH2_PASSWD_CHANGEREQ_FUNC((*passwd_change_cb)))
{
    int rc;
    BLOCK_ADJUST(rc, session,
                 userauth_password(session, username, username_len,
                                   (unsigned char *)password, password_len,
                                   passwd_change_cb));
    return rc;
}